

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  Node *initial_node;
  Edge *pEVar2;
  bool bVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  pointer ppNVar6;
  Edge *edge;
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  Edge *local_90;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_88;
  _Base_ptr local_70;
  DependencyScan *local_68;
  _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = scan;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)&local_60);
  local_70 = &(this->want_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
LAB_001086b7:
      std::
      _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
      ~_Rb_tree(&local_60);
      return (_Rb_tree_header *)p_Var5 == p_Var1;
    }
    initial_node = *(Node **)(p_Var5 + 1);
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = DependencyScan::RecomputeDirty
                      (local_68,initial_node,(vector<Node_*,_std::allocator<Node_*>_> *)&local_88,
                       err);
    ppNVar6 = local_88._M_impl.super__Vector_impl_data._M_start;
    if (!bVar3) {
LAB_001086ad:
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_88);
      goto LAB_001086b7;
    }
    for (; ppNVar6 != local_88._M_impl.super__Vector_impl_data._M_finish; ppNVar6 = ppNVar6 + 1) {
      pEVar2 = (*ppNVar6)->in_edge_;
      if (((pEVar2 != (Edge *)0x0) && (pEVar2->outputs_ready_ == false)) &&
         (bVar3 = AddTarget(this,*ppNVar6,err), !bVar3)) goto LAB_001086ad;
    }
    if (initial_node->dirty_ == true) {
      local_90 = initial_node->in_edge_;
      if ((local_90 == (Edge *)0x0) || (local_90->outputs_ready_ == true)) {
        __assert_fail("edge && !edge->outputs_ready()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                      ,0x19f,
                      "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                     );
      }
      iVar4 = std::
              _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
              ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                      *)this,&local_90);
      if (iVar4._M_node == local_70) {
        __assert_fail("want_e != want_.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                      ,0x1a1,
                      "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                     );
      }
      if (*(int *)&iVar4._M_node[1]._M_parent == 0) {
        *(undefined4 *)&iVar4._M_node[1]._M_parent = 1;
        EdgeWanted(this,local_90);
      }
    }
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_88);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    std::vector<Node*> validation_nodes;
    if (!scan->RecomputeDirty(n, &validation_nodes, err))
      return false;

    // Add any validation nodes found during RecomputeDirty as new top level
    // targets.
    for (std::vector<Node*>::iterator v = validation_nodes.begin();
         v != validation_nodes.end(); ++v) {
      if (Edge* in_edge = (*v)->in_edge()) {
        if (!in_edge->outputs_ready() &&
            !AddTarget(*v, err)) {
          return false;
        }
      }
    }
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}